

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# http.c
# Opt level: O3

int Qiniu_Json_GetBoolean(Qiniu_Json *self,char *key,int defval)

{
  cJSON *pcVar1;
  
  if (((self != (Qiniu_Json *)0x0) &&
      (pcVar1 = cJSON_GetObjectItem(self,key), pcVar1 != (cJSON *)0x0)) && ((uint)pcVar1->type < 2))
  {
    return pcVar1->type;
  }
  return defval;
}

Assistant:

int Qiniu_Json_GetBoolean(Qiniu_Json *self, const char *key, int defval)
{
    Qiniu_Json *sub;
    if (self == NULL)
    {
        return defval;
    } // if
    sub = cJSON_GetObjectItem(self, key);
    if (sub != NULL)
    {
        if (sub->type == cJSON_False)
        {
            return 0;
        }
        else if (sub->type == cJSON_True)
        {
            return 1;
        } // if
    }     // if
    return defval;
}